

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O0

double __thiscall Activation::run(Activation *this,double input)

{
  bool bVar1;
  reference param_00;
  double dVar2;
  Func_Param *param;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Func_Param,_std::allocator<Func_Param>_> *__range1;
  double result;
  double input_local;
  Activation *this_local;
  
  __range1 = (vector<Func_Param,_std::allocator<Func_Param>_> *)0x0;
  __end1 = std::vector<Func_Param,_std::allocator<Func_Param>_>::begin(&this->m_params);
  param = (Func_Param *)std::vector<Func_Param,_std::allocator<Func_Param>_>::end(&this->m_params);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Func_Param_*,_std::vector<Func_Param,_std::allocator<Func_Param>_>_>
                                *)&param);
    if (!bVar1) break;
    param_00 = __gnu_cxx::
               __normal_iterator<const_Func_Param_*,_std::vector<Func_Param,_std::allocator<Func_Param>_>_>
               ::operator*(&__end1);
    dVar2 = gate(param_00,input);
    __range1 = (vector<Func_Param,_std::allocator<Func_Param>_> *)(dVar2 + (double)__range1);
    __gnu_cxx::
    __normal_iterator<const_Func_Param_*,_std::vector<Func_Param,_std::allocator<Func_Param>_>_>::
    operator++(&__end1);
  }
  return (double)__range1;
}

Assistant:

double Activation::run(double input) const{
    double result=0.;
    for(const auto& param: m_params)
        result+=Activation::gate(param, input);
    return result;
}